

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O0

lu_byte luaH_get(Table *t,TValue *key,TValue *res)

{
  lu_byte lVar1;
  int iVar2;
  lua_Integer local_38;
  lua_Integer k;
  TValue *slot;
  TValue *res_local;
  TValue *key_local;
  Table *t_local;
  
  slot = res;
  res_local = key;
  key_local = (TValue *)t;
  switch(key->tt_ & 0x3f) {
  case 0:
    k = (lua_Integer)&absentkey;
    break;
  case 3:
    lVar1 = luaH_getint(t,(key->value_).i,res);
    return lVar1;
  case 4:
    k = (lua_Integer)luaH_Hgetshortstr(t,(TString *)(key->value_).gc);
    break;
  case 0x13:
    iVar2 = luaV_flttointeger((key->value_).n,&local_38,F2Ieq);
    if (iVar2 != 0) {
      lVar1 = luaH_getint((Table *)key_local,local_38,slot);
      return lVar1;
    }
  default:
    k = (lua_Integer)getgeneric((Table *)key_local,res_local,0);
  }
  lVar1 = finishnodeget((TValue *)k,slot);
  return lVar1;
}

Assistant:

lu_byte luaH_get (Table *t, const TValue *key, TValue *res) {
  const TValue *slot;
  switch (ttypetag(key)) {
    case LUA_VSHRSTR:
      slot = luaH_Hgetshortstr(t, tsvalue(key));
      break;
    case LUA_VNUMINT:
      return luaH_getint(t, ivalue(key), res);
    case LUA_VNIL:
      slot = &absentkey;
      break;
    case LUA_VNUMFLT: {
      lua_Integer k;
      if (luaV_flttointeger(fltvalue(key), &k, F2Ieq)) /* integral index? */
        return luaH_getint(t, k, res);  /* use specialized version */
      /* else... */
    }  /* FALLTHROUGH */
    default:
      slot = getgeneric(t, key, 0);
      break;
  }
  return finishnodeget(slot, res);
}